

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImVec2 CalcSizeAutoFit(ImGuiWindow *window,ImVec2 *size_contents)

{
  ImGuiContext *pIVar1;
  ImVec2 IVar2;
  float local_6c;
  float fStack_68;
  ImVec2 size_auto_fit_after_constraint;
  ImVec2 local_5c;
  ImVec2 local_54;
  ImVec2 local_4c;
  ImVec2 local_44;
  ImVec2 local_3c;
  ImVec2 size_min;
  bool is_menu;
  bool is_popup;
  ImGuiStyle *style;
  ImGuiContext *g;
  ImVec2 *size_contents_local;
  ImGuiWindow *window_local;
  ImVec2 size_auto_fit;
  
  pIVar1 = GImGui;
  register0x00000000 = &GImGui->Style;
  if ((window->Flags & 0x2000000U) == 0) {
    size_min.x._3_1_ = (window->Flags & 0x4000000U) != 0;
    size_min.x._2_1_ = (window->Flags & 0x10000000U) != 0;
    local_3c = (GImGui->Style).WindowMinSize;
    if (((bool)size_min.x._3_1_) || ((bool)size_min.x._2_1_)) {
      ImVec2::ImVec2(&local_4c,4.0,4.0);
      local_44 = ImMin(&local_3c,&local_4c);
      local_3c = local_44;
    }
    size_auto_fit_after_constraint = operator*(&stack0xffffffffffffffd0->DisplaySafeAreaPadding,2.0)
    ;
    local_5c = operator-(&(pIVar1->IO).DisplaySize,&size_auto_fit_after_constraint);
    local_54 = ImMax(&local_3c,&local_5c);
    window_local = (ImGuiWindow *)ImClamp(size_contents,&local_3c,local_54);
    IVar2 = CalcSizeAfterConstraint(window,(ImVec2)window_local);
    local_6c = IVar2.x;
    if (((local_6c < size_contents->x) && ((window->Flags & 8U) == 0)) &&
       ((window->Flags & 0x800U) != 0)) {
      window_local = (ImGuiWindow *)
                     CONCAT44(stack0xffffffffffffffd0->ScrollbarSize + window_local._4_4_,
                              window_local._0_4_);
    }
    fStack_68 = IVar2.y;
    if ((fStack_68 < size_contents->y) && ((window->Flags & 8U) == 0)) {
      window_local = (ImGuiWindow *)
                     CONCAT44(window_local._4_4_,
                              stack0xffffffffffffffd0->ScrollbarSize + window_local._0_4_);
    }
  }
  else {
    window_local = *(ImGuiWindow **)size_contents;
  }
  return (ImVec2)window_local;
}

Assistant:

static ImVec2 CalcSizeAutoFit(ImGuiWindow* window, const ImVec2& size_contents)
{
    ImGuiContext& g = *GImGui;
    ImGuiStyle& style = g.Style;
    if (window->Flags & ImGuiWindowFlags_Tooltip)
    {
        // Tooltip always resize
        return size_contents;
    }
    else
    {
        // Maximum window size is determined by the display size
        const bool is_popup = (window->Flags & ImGuiWindowFlags_Popup) != 0;
        const bool is_menu = (window->Flags & ImGuiWindowFlags_ChildMenu) != 0;
        ImVec2 size_min = style.WindowMinSize;
        if (is_popup || is_menu) // Popups and menus bypass style.WindowMinSize by default, but we give then a non-zero minimum size to facilitate understanding problematic cases (e.g. empty popups)
            size_min = ImMin(size_min, ImVec2(4.0f, 4.0f));
        ImVec2 size_auto_fit = ImClamp(size_contents, size_min, ImMax(size_min, g.IO.DisplaySize - style.DisplaySafeAreaPadding * 2.0f));

        // When the window cannot fit all contents (either because of constraints, either because screen is too small),
        // we are growing the size on the other axis to compensate for expected scrollbar. FIXME: Might turn bigger than ViewportSize-WindowPadding.
        ImVec2 size_auto_fit_after_constraint = CalcSizeAfterConstraint(window, size_auto_fit);
        if (size_auto_fit_after_constraint.x < size_contents.x && !(window->Flags & ImGuiWindowFlags_NoScrollbar) && (window->Flags & ImGuiWindowFlags_HorizontalScrollbar))
            size_auto_fit.y += style.ScrollbarSize;
        if (size_auto_fit_after_constraint.y < size_contents.y && !(window->Flags & ImGuiWindowFlags_NoScrollbar))
            size_auto_fit.x += style.ScrollbarSize;
        return size_auto_fit;
    }
}